

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_func_call_arg_abi_cxx11_(CompilerMSL *this,Parameter *arg,uint32_t id)

{
  MSLFormatResolution MVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  TypedID<(spirv_cross::Types)0> *pTVar5;
  TypedID<(spirv_cross::Types)0> *__last;
  Variant *pVVar6;
  Variant *pVVar7;
  CompilerError *pCVar8;
  size_type sVar9;
  uint32_t in_ECX;
  undefined4 in_register_00000014;
  uint32_t local_708;
  undefined1 local_660 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620 [36];
  uint32_t local_5fc;
  SPIRVariable *local_5f8;
  SPIRVariable *backing_var;
  string local_5d0 [36];
  VariableID local_5ac;
  undefined1 local_5a8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508 [32];
  spirv_cross local_4e8 [32];
  spirv_cross local_4c8 [32];
  spirv_cross local_4a8 [32];
  spirv_cross local_488 [39];
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [39];
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [32];
  undefined1 local_2d8 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  samp_args;
  undefined1 local_180 [64];
  uint local_140;
  uint32_t local_13c;
  uint32_t i;
  uint32_t planes;
  MSLConstexprSampler *constexpr_sampler;
  SPIRVariable *var;
  undefined1 local_120 [4];
  uint32_t var_id;
  undefined1 local_100 [32];
  undefined1 local_e0 [36];
  TypedID<(spirv_cross::Types)0> local_bc;
  Variant *local_b8;
  TypedID<(spirv_cross::Types)0> *itr;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *constants;
  SPIRConstant *local_88;
  SPIRConstant *c;
  spirv_cross local_60 [34];
  byte local_3e;
  byte local_3d;
  bool arg_is_dynamic_img_sampler;
  bool is_dynamic_img_sampler;
  SPIRType *local_30;
  SPIRType *type;
  __buckets_ptr pp_Stack_20;
  uint32_t id_local;
  Parameter *arg_local;
  CompilerMSL *this_local;
  string *arg_str;
  
  pp_Stack_20 = (__buckets_ptr)CONCAT44(in_register_00000014,id);
  type._3_1_ = 0;
  type._4_4_ = in_ECX;
  arg_local = arg;
  this_local = this;
  ::std::__cxx11::string::string((string *)this);
  local_30 = Compiler::expression_type((Compiler *)arg,type._4_4_);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)pp_Stack_20 + 4));
  local_3d = Compiler::has_extended_decoration
                       ((Compiler *)arg,uVar3,SPIRVCrossDecorationDynamicImageSampler);
  local_3e = Compiler::has_extended_decoration
                       ((Compiler *)arg,type._4_4_,SPIRVCrossDecorationDynamicImageSampler);
  if (((local_3d & 1) != 0) && (!(bool)local_3e)) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_30->image);
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar3);
    (**(code **)(*(long *)arg + 0x98))(&c,arg,pSVar4,0);
    join<char_const(&)[24],std::__cxx11::string,char_const(&)[3]>
              (local_60,(char (*) [24])"spvDynamicImageSampler<",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
               (char (*) [3])0x423e93);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_60);
    ::std::__cxx11::string::~string((string *)local_60);
    ::std::__cxx11::string::~string((string *)&c);
  }
  local_88 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)arg,type._4_4_);
  if (((arg[0x1fc].field_0x13 & 1) != 0) && (local_88 != (SPIRConstant *)0x0)) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_88->super_IVariant).field_0xc)
    ;
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)arg,uVar3);
    bVar2 = VectorView<unsigned_int>::empty(&(pSVar4->array).super_VectorView<unsigned_int>);
    if (!bVar2) {
      join<char_const(&)[2],unsigned_int&,char_const(&)[12]>
                ((spirv_cross *)&constants,(char (*) [2])0x40fecd,(uint *)((long)&type + 4),
                 (char (*) [12])"_array_copy");
      ::std::__cxx11::string::operator=((string *)this,(string *)&constants);
      ::std::__cxx11::string::~string((string *)&constants);
      itr = (TypedID<(spirv_cross::Types)0> *)(*(long *)(arg + 0x66) + 0x2e0);
      pTVar5 = ::std::
               begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)itr);
      __last = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)itr);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_bc,type._4_4_);
      pVVar6 = (Variant *)
               ::std::
               find<spirv_cross::TypedID<(spirv_cross::Types)0>*,spirv_cross::TypedID<(spirv_cross::Types)0>>
                         (pTVar5,__last,&local_bc);
      local_b8 = pVVar6;
      pVVar7 = (Variant *)
               ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,8ul>>
                         ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)itr);
      if (pVVar6 == pVVar7) {
        Compiler::force_recompile((Compiler *)arg);
        pTVar5 = itr;
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)(local_e0 + 0x20),type._4_4_);
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::push_back
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *)pTVar5,
                   (TypedID<(spirv_cross::Types)0> *)(local_e0 + 0x20));
      }
      goto LAB_002e8476;
    }
  }
  bVar2 = CompilerGLSL::should_dereference_caller_param((CompilerGLSL *)arg,type._4_4_);
  pSVar4 = local_30;
  if (bVar2) {
    CompilerGLSL::to_func_call_arg_abi_cxx11_((CompilerGLSL *)local_100,arg,(uint32_t)pp_Stack_20);
    CompilerGLSL::dereference_expression((CompilerGLSL *)local_e0,(SPIRType *)arg,(string *)pSVar4);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_e0);
    ::std::__cxx11::string::~string((string *)local_e0);
    ::std::__cxx11::string::~string((string *)local_100);
  }
  else {
    CompilerGLSL::to_func_call_arg_abi_cxx11_((CompilerGLSL *)local_120,arg,(uint32_t)pp_Stack_20);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_120);
    ::std::__cxx11::string::~string((string *)local_120);
  }
LAB_002e8476:
  var._4_4_ = 0;
  constexpr_sampler =
       (MSLConstexprSampler *)
       Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)arg,type._4_4_);
  if ((SPIRVariable *)constexpr_sampler != (SPIRVariable *)0x0) {
    var._4_4_ = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&((SPIRVariable *)constexpr_sampler)->basevariable);
  }
  uVar3 = (uint32_t)arg;
  if ((local_3e & 1) == 0) {
    if (var._4_4_ == 0) {
      local_708 = type._4_4_;
    }
    else {
      local_708 = var._4_4_;
    }
    _i = find_constexpr_sampler((CompilerMSL *)arg,local_708);
    if (local_30->basetype == SampledImage) {
      local_13c = 1;
      if (((_i != (MSLConstexprSampler *)0x0) && ((_i->ycbcr_conversion_enable & 1U) != 0)) &&
         (local_13c = _i->planes, ((ulong)pp_Stack_20[2] & 1) == 0)) {
        add_spv_func_and_recompile((CompilerMSL *)arg,SPVFuncImplDynamicImageSampler);
      }
      for (local_140 = 1; local_140 < local_13c; local_140 = local_140 + 1) {
        CompilerGLSL::to_func_call_arg_abi_cxx11_
                  ((CompilerGLSL *)local_180,arg,(uint32_t)pp_Stack_20);
        join<char_const(&)[3],std::__cxx11::string,std::__cxx11::string&,unsigned_int&>
                  ((spirv_cross *)(local_180 + 0x20),(char (*) [3])0x421228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &arg[0x241].id,&local_140);
        ::std::__cxx11::string::operator+=((string *)this,(string *)(local_180 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_180 + 0x20));
        ::std::__cxx11::string::~string((string *)local_180);
      }
      if ((local_30->image).dim != DimBuffer) {
        to_sampler_expression_abi_cxx11_
                  ((CompilerMSL *)(samp_args.stack_storage.aligned_char + 0xf8),uVar3);
        ::std::operator+(&stack0xfffffffffffffe60,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x421228);
        ::std::__cxx11::string::operator+=((string *)this,(string *)&stack0xfffffffffffffe60);
        ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe60);
        ::std::__cxx11::string::~string((string *)(samp_args.stack_storage.aligned_char + 0xf8));
      }
      if ((((local_3d & 1) != 0) && (_i != (MSLConstexprSampler *)0x0)) &&
         ((_i->ycbcr_conversion_enable & 1U) != 0)) {
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8);
        MVar1 = _i->resolution;
        if (MVar1 != MSL_FORMAT_RESOLUTION_444) {
          if (MVar1 == MSL_FORMAT_RESOLUTION_422) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_2f8,"spvFormatResolution::_422",&local_2f9);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)local_2d8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_2f8);
            ::std::__cxx11::string::~string(local_2f8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
          }
          else {
            if (MVar1 != MSL_FORMAT_RESOLUTION_420) {
              pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError(pCVar8,"Invalid format resolution.");
              __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_320,"spvFormatResolution::_420",&local_321);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)local_2d8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_320);
            ::std::__cxx11::string::~string(local_320);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_321);
          }
        }
        if (_i->chroma_filter != MSL_SAMPLER_FILTER_NEAREST) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_348,"spvChromaFilter::linear",&local_349);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348
                     );
          ::std::__cxx11::string::~string(local_348);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_349);
        }
        if (_i->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_370,"spvXChromaLocation::midpoint",&local_371);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370
                     );
          ::std::__cxx11::string::~string(local_370);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_371);
        }
        if (_i->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_398,"spvYChromaLocation::midpoint",&local_399);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398
                     );
          ::std::__cxx11::string::~string(local_398);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_399);
        }
        switch(_i->ycbcr_model) {
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
          break;
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_3c0,"spvYCbCrModelConversion::ycbcr_identity",&local_3c1);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0
                     );
          ::std::__cxx11::string::~string(local_3c0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
          break;
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_3e8,"spvYCbCrModelConversion::ycbcr_bt_709",&local_3e9);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8
                     );
          ::std::__cxx11::string::~string(local_3e8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
          break;
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_410,"spvYCbCrModelConversion::ycbcr_bt_601",&local_411);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410
                     );
          ::std::__cxx11::string::~string(local_410);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_411);
          break;
        case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_438,"spvYCbCrModelConversion::ycbcr_bt_2020",&local_439);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438
                     );
          ::std::__cxx11::string::~string(local_438);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_439);
          break;
        default:
          pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar8,"Invalid Y\'CbCr model conversion.");
          __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (_i->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_460,"spvYCbCrRange::itu_narrow",&local_461);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_2d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460
                     );
          ::std::__cxx11::string::~string(local_460);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_461);
        }
        join<char_const(&)[18],unsigned_int_const&,char_const(&)[2]>
                  (local_488,(char (*) [18])"spvComponentBits(",&_i->bpc,(char (*) [2])0x40bd22);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_2d8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488);
        ::std::__cxx11::string::~string((string *)local_488);
        merge(local_4c8,
              (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
               *)local_2d8,", ");
        join<char_const(&)[19],std::__cxx11::string,char_const(&)[2]>
                  (local_4a8,(char (*) [19])", spvYCbCrSampler(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c8,
                   (char (*) [2])0x40bd22);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_4a8);
        ::std::__cxx11::string::~string((string *)local_4a8);
        ::std::__cxx11::string::~string((string *)local_4c8);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                        *)local_2d8);
      }
    }
    if ((((local_3d & 1) == 0) || (_i == (MSLConstexprSampler *)0x0)) ||
       ((_i->ycbcr_conversion_enable & 1U) == 0)) {
      if ((((arg[0x1fb].write_count & 0x100) != 0) && ((arg[0x233].write_count & 1) != 0)) &&
         (bVar2 = Compiler::is_sampled_image_type((Compiler *)arg,local_30), bVar2)) {
        to_swizzle_expression_abi_cxx11_((CompilerMSL *)local_5a8,uVar3);
        ::std::operator+(local_5a8 + 0x20,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x421228);
        ::std::__cxx11::string::operator+=((string *)this,(string *)(local_5a8 + 0x20));
        ::std::__cxx11::string::~string((string *)(local_5a8 + 0x20));
        ::std::__cxx11::string::~string((string *)local_5a8);
      }
    }
    else {
      create_swizzle_abi_cxx11_((MSLComponentSwizzle)local_508);
      create_swizzle_abi_cxx11_((MSLComponentSwizzle)local_528);
      create_swizzle_abi_cxx11_((MSLComponentSwizzle)local_548);
      create_swizzle_abi_cxx11_((MSLComponentSwizzle)local_568);
      join<char_const(&)[9],std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char_const(&)[18],std::__cxx11::string,char_const(&)[16],std::__cxx11::string,char_const(&)[2]>
                (local_4e8,(char (*) [9])", (uint(",local_508,(char (*) [18])") << 24) | (uint(",
                 local_528,(char (*) [18])") << 16) | (uint(",local_548,
                 (char (*) [16])") << 8) | uint(",local_568,(char (*) [2])0x40bd22);
      ::std::__cxx11::string::operator+=((string *)this,(string *)local_4e8);
      ::std::__cxx11::string::~string((string *)local_4e8);
      ::std::__cxx11::string::~string((string *)local_568);
      ::std::__cxx11::string::~string((string *)local_548);
      ::std::__cxx11::string::~string((string *)local_528);
      ::std::__cxx11::string::~string((string *)local_508);
    }
    TypedID<(spirv_cross::Types)2>::TypedID(&local_5ac,var._4_4_);
    bVar2 = buffer_requires_array_length((CompilerMSL *)arg,local_5ac);
    if (bVar2) {
      to_buffer_size_expression_abi_cxx11_((CompilerMSL *)&backing_var,uVar3);
      ::std::operator+((char *)local_5d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x421228
                      );
      ::std::__cxx11::string::operator+=((string *)this,local_5d0);
      ::std::__cxx11::string::~string(local_5d0);
      ::std::__cxx11::string::~string((string *)&backing_var);
    }
    if ((local_3d & 1) != 0) {
      ::std::__cxx11::string::operator+=((string *)this,")");
    }
  }
  local_5f8 = Compiler::maybe_get_backing_variable((Compiler *)arg,var._4_4_);
  bVar2 = false;
  if (local_5f8 != (SPIRVariable *)0x0) {
    local_5fc = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_5f8->super_IVariant).self)
    ;
    sVar9 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&arg[0x25d].write_count,&local_5fc);
    bVar2 = sVar9 != 0;
  }
  if (bVar2) {
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_660,uVar3,SUB41(var._4_4_,0));
    ::std::operator+(local_660 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x421228);
    ::std::operator+(local_620,local_660 + 0x20);
    ::std::__cxx11::string::operator+=((string *)this,(string *)local_620);
    ::std::__cxx11::string::~string((string *)local_620);
    ::std::__cxx11::string::~string((string *)(local_660 + 0x20));
    ::std::__cxx11::string::~string((string *)local_660);
  }
  return this;
}

Assistant:

string CompilerMSL::to_func_call_arg(const SPIRFunction::Parameter &arg, uint32_t id)
{
	string arg_str;

	auto &type = expression_type(id);
	bool is_dynamic_img_sampler = has_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	// If the argument *itself* is a "dynamic" combined-image sampler, then we can just pass that around.
	bool arg_is_dynamic_img_sampler = has_extended_decoration(id, SPIRVCrossDecorationDynamicImageSampler);
	if (is_dynamic_img_sampler && !arg_is_dynamic_img_sampler)
		arg_str = join("spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">(");

	auto *c = maybe_get<SPIRConstant>(id);
	if (msl_options.force_native_arrays && c && !get<SPIRType>(c->constant_type).array.empty())
	{
		// If we are passing a constant array directly to a function for some reason,
		// the callee will expect an argument in thread const address space
		// (since we can only bind to arrays with references in MSL).
		// To resolve this, we must emit a copy in this address space.
		// This kind of code gen should be rare enough that performance is not a real concern.
		// Inline the SPIR-V to avoid this kind of suboptimal codegen.
		//
		// We risk calling this inside a continue block (invalid code),
		// so just create a thread local copy in the current function.
		arg_str = join("_", id, "_array_copy");
		auto &constants = current_function->constant_arrays_needed_on_stack;
		auto itr = find(begin(constants), end(constants), ID(id));
		if (itr == end(constants))
		{
			force_recompile();
			constants.push_back(id);
		}
	}
	// Dereference pointer variables where needed.
	// FIXME: This dereference is actually backwards. We should really just support passing pointer variables between functions.
	else if (should_dereference_caller_param(id))
		arg_str += dereference_expression(type, CompilerGLSL::to_func_call_arg(arg, id));
	else
		arg_str += CompilerGLSL::to_func_call_arg(arg, id);

	// Need to check the base variable in case we need to apply a qualified alias.
	uint32_t var_id = 0;
	auto *var = maybe_get<SPIRVariable>(id);
	if (var)
		var_id = var->basevariable;

	if (!arg_is_dynamic_img_sampler)
	{
		auto *constexpr_sampler = find_constexpr_sampler(var_id ? var_id : id);
		if (type.basetype == SPIRType::SampledImage)
		{
			// Manufacture automatic plane args for multiplanar texture
			uint32_t planes = 1;
			if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			{
				planes = constexpr_sampler->planes;
				// If this parameter isn't aliasing a global, then we need to use
				// the special "dynamic image-sampler" class to pass it--and we need
				// to use it for *every* non-alias parameter, in case a combined
				// image-sampler with a Y'CbCr conversion is passed. Hopefully, this
				// pathological case is so rare that it should never be hit in practice.
				if (!arg.alias_global_variable)
					add_spv_func_and_recompile(SPVFuncImplDynamicImageSampler);
			}
			for (uint32_t i = 1; i < planes; i++)
				arg_str += join(", ", CompilerGLSL::to_func_call_arg(arg, id), plane_name_suffix, i);
			// Manufacture automatic sampler arg if the arg is a SampledImage texture.
			if (type.image.dim != DimBuffer)
				arg_str += ", " + to_sampler_expression(var_id ? var_id : id);

			// Add sampler Y'CbCr conversion info if we have it
			if (is_dynamic_img_sampler && constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			{
				SmallVector<string> samp_args;

				switch (constexpr_sampler->resolution)
				{
				case MSL_FORMAT_RESOLUTION_444:
					// Default
					break;
				case MSL_FORMAT_RESOLUTION_422:
					samp_args.push_back("spvFormatResolution::_422");
					break;
				case MSL_FORMAT_RESOLUTION_420:
					samp_args.push_back("spvFormatResolution::_420");
					break;
				default:
					SPIRV_CROSS_THROW("Invalid format resolution.");
				}

				if (constexpr_sampler->chroma_filter != MSL_SAMPLER_FILTER_NEAREST)
					samp_args.push_back("spvChromaFilter::linear");

				if (constexpr_sampler->x_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN)
					samp_args.push_back("spvXChromaLocation::midpoint");
				if (constexpr_sampler->y_chroma_offset != MSL_CHROMA_LOCATION_COSITED_EVEN)
					samp_args.push_back("spvYChromaLocation::midpoint");
				switch (constexpr_sampler->ycbcr_model)
				{
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_RGB_IDENTITY:
					// Default
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_IDENTITY:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_identity");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_709:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_709");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_601:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_601");
					break;
				case MSL_SAMPLER_YCBCR_MODEL_CONVERSION_YCBCR_BT_2020:
					samp_args.push_back("spvYCbCrModelConversion::ycbcr_bt_2020");
					break;
				default:
					SPIRV_CROSS_THROW("Invalid Y'CbCr model conversion.");
				}
				if (constexpr_sampler->ycbcr_range != MSL_SAMPLER_YCBCR_RANGE_ITU_FULL)
					samp_args.push_back("spvYCbCrRange::itu_narrow");
				samp_args.push_back(join("spvComponentBits(", constexpr_sampler->bpc, ")"));
				arg_str += join(", spvYCbCrSampler(", merge(samp_args), ")");
			}
		}

		if (is_dynamic_img_sampler && constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
			arg_str += join(", (uint(", create_swizzle(constexpr_sampler->swizzle[3]), ") << 24) | (uint(",
			                create_swizzle(constexpr_sampler->swizzle[2]), ") << 16) | (uint(",
			                create_swizzle(constexpr_sampler->swizzle[1]), ") << 8) | uint(",
			                create_swizzle(constexpr_sampler->swizzle[0]), ")");
		else if (msl_options.swizzle_texture_samples && has_sampled_images && is_sampled_image_type(type))
			arg_str += ", " + to_swizzle_expression(var_id ? var_id : id);

		if (buffer_requires_array_length(var_id))
			arg_str += ", " + to_buffer_size_expression(var_id ? var_id : id);

		if (is_dynamic_img_sampler)
			arg_str += ")";
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(var_id);
	if (backing_var && atomic_image_vars_emulated.count(backing_var->self))
	{
		arg_str += ", " + to_expression(var_id) + "_atomic";
	}

	return arg_str;
}